

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O1

int IDASetLinearSolutionScalingB(void *ida_mem,int which,int onoffB)

{
  int iVar1;
  IDABMem IDAB_mem;
  IDALsMemB idalsB_mem;
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDABMem local_28;
  IDALsMemB local_20;
  IDAMem local_18;
  IDAadjMem local_10;
  
  iVar1 = idaLs_AccessLMemB(ida_mem,which,"IDASetLinearSolutionScalingB",&local_18,&local_10,
                            &local_28,&local_20);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = IDASetLinearSolutionScaling(local_28->IDA_mem,onoffB);
  return iVar1;
}

Assistant:

int IDASetLinearSolutionScalingB(void* ida_mem, int which, sunbooleantype onoffB)
{
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  IDABMem IDAB_mem;
  IDALsMemB idalsB_mem;
  void* ida_memB;
  int retval;

  /* access relevant memory structures */
  retval = idaLs_AccessLMemB(ida_mem, which, "IDASetLinearSolutionScalingB",
                             &IDA_mem, &IDAADJ_mem, &IDAB_mem, &idalsB_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* call corresponding routine for IDAB_mem structure */
  ida_memB = (void*)IDAB_mem->IDA_mem;
  return (IDASetLinearSolutionScaling(ida_memB, onoffB));
}